

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

int IpmiFruEncodeDynamic
              (void *buffer,uint offset,size_t size,uint16_t instance_id,int *piece_offset)

{
  bool bVar1;
  uint local_44;
  ulong uStack_40;
  int last_piece;
  size_t piece_size;
  int MAX_PIECE_SIZE;
  int *piece_offset_local;
  uint16_t instance_id_local;
  size_t size_local;
  uint offset_local;
  void *buffer_local;
  
  uStack_40 = size - (long)*piece_offset;
  bVar1 = 0xf8 < uStack_40;
  if (bVar1) {
    uStack_40 = 0xf8;
  }
  local_44 = (uint)!bVar1;
  multirecord.data._0_2_ = instance_id;
  memcpy(multirecord.data + 2,(void *)((long)buffer + (long)*piece_offset + (ulong)offset),uStack_40
        );
  IpmiFillPICMGHeader('7',uStack_40 + 2);
  *piece_offset = *piece_offset + (int)uStack_40;
  return local_44;
}

Assistant:

BOOL IpmiFruEncodeDynamic(void *buffer, unsigned int offset, size_t size, uint16_t instance_id, int *piece_offset)
{
    const int MAX_PIECE_SIZE = IPMI_FRUINFO_MAX_MULTIRECORD_SIZE - 
                            sizeof(ipmi_fru_picmg_dynamic_eeep_record_header_t);
    size_t piece_size = size - (*piece_offset);
    BOOL last_piece = TRUE;
    if (piece_size > MAX_PIECE_SIZE) {
        piece_size = MAX_PIECE_SIZE;
        last_piece = FALSE;
    }
    multirecord.data[0] = instance_id & 0xFF;
    multirecord.data[1] = (instance_id >> 8) & 0xFF;
    memcpy(multirecord.data + 2, (uint8_t *)buffer + offset + (*piece_offset), piece_size);
    IpmiFillPICMGHeader(PICMG_RECORD_ID_EEEP_DYNAMIC_BLOCK, piece_size + 2);
    (*piece_offset) += piece_size;
    return last_piece;
}